

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_>::rehash
          (Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *this,size_t sizeHint)

{
  uchar *puVar1;
  ulong uVar2;
  Span *pSVar3;
  Entry *pEVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ulong uVar9;
  ulong uVar10;
  Node<int,_QEvdevTouchScreenData::Contact> *pNVar11;
  ulong uVar12;
  Span *pSVar13;
  size_t numBuckets;
  size_t index;
  long lVar14;
  long lVar15;
  R RVar16;
  Bucket BVar17;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  numBuckets = 0x80;
  if ((0x40 < sizeHint) && (numBuckets = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar14 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar14 == 0; lVar14 = lVar14 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar14 ^ 0x3f) & 0x3f);
  }
  uVar2 = this->numBuckets;
  pSVar3 = this->spans;
  RVar16 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar16.spans;
  this->numBuckets = numBuckets;
  if (uVar2 < 0x80) {
    if (pSVar3 == (Span *)0x0) {
      return;
    }
  }
  else {
    uVar12 = 0;
    pSVar13 = pSVar3;
    do {
      lVar14 = 0;
      do {
        uVar9 = (ulong)pSVar13->offsets[lVar14];
        if (uVar9 != 0xff) {
          pEVar4 = pSVar3[uVar12].entries;
          uVar10 = (long)*(int *)pEVar4[uVar9].storage.data ^ this->seed;
          uVar10 = (uVar10 >> 0x20 ^ uVar10) * -0x2917014799a6026d;
          uVar10 = (uVar10 >> 0x20 ^ uVar10) * -0x2917014799a6026d;
          BVar17 = findBucketWithHash<int>(this,(int *)(pEVar4 + uVar9),uVar10 >> 0x20 ^ uVar10);
          pNVar11 = Span<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_>::insert
                              (BVar17.span,BVar17.index);
          uVar5 = *(undefined8 *)pEVar4[uVar9].storage.data;
          uVar6 = *(undefined8 *)(pEVar4[uVar9].storage.data + 8);
          puVar1 = pEVar4[uVar9].storage.data + 0xc;
          uVar7 = *(undefined8 *)puVar1;
          uVar8 = *(undefined8 *)(puVar1 + 8);
          pNVar11->key = (int)uVar5;
          (pNVar11->value).trackingId = (int)((ulong)uVar5 >> 0x20);
          (pNVar11->value).x = (int)uVar6;
          (pNVar11->value).y = (int)((ulong)uVar6 >> 0x20);
          (pNVar11->value).y = (int)uVar7;
          (pNVar11->value).maj = (int)((ulong)uVar7 >> 0x20);
          (pNVar11->value).pressure = (int)uVar8;
          (pNVar11->value).state = (char)((ulong)uVar8 >> 0x20);
          *(int3 *)&(pNVar11->value).field_0x15 = (int3)((ulong)uVar8 >> 0x28);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0x80);
      if (pSVar3[uVar12].entries != (Entry *)0x0) {
        operator_delete__(pSVar3[uVar12].entries);
        pSVar3[uVar12].entries = (Entry *)0x0;
      }
      uVar12 = uVar12 + 1;
      pSVar13 = pSVar13 + 1;
    } while (uVar12 != uVar2 >> 7);
  }
  lVar14 = *(long *)&pSVar3[-1].allocated;
  if (lVar14 != 0) {
    lVar15 = lVar14 * 0x90;
    do {
      if (*(void **)(pSVar3->offsets + lVar15 + -0x10) != (void *)0x0) {
        operator_delete__(*(void **)(pSVar3->offsets + lVar15 + -0x10));
        puVar1 = pSVar3->offsets + lVar15 + -0x10;
        puVar1[0] = '\0';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        puVar1[4] = '\0';
        puVar1[5] = '\0';
        puVar1[6] = '\0';
        puVar1[7] = '\0';
      }
      lVar15 = lVar15 + -0x90;
    } while (lVar15 != 0);
  }
  operator_delete__(&pSVar3[-1].allocated,lVar14 * 0x90 + 8);
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }